

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O2

void genInstruction(int a,int b)

{
  if (b < 0x10) {
    b = b + a * 0x10;
  }
  else {
    genInstruction(0,a);
  }
  genByte(b);
  return;
}

Assistant:

void genInstruction(int a, int b)
{
    /*printf("gen instruction %d %d\n", a, b); */
    if (b < 16) {
        genByte(a * 16 + b);
    } else {
        genInstruction(0, a);
        genByte(b);
    }
}